

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

int LZ4_resetStreamStateHC(void *state,char *inputBuffer)

{
  LZ4_streamHC_t *LZ4_streamHCPtr;
  bool bVar1;
  
  bVar1 = ((ulong)state & 7) != 0;
  if (!bVar1 && state != (void *)0x0) {
    memset(state,0,0x40030);
    *(undefined2 *)((long)state + 0x40024) = 9;
    LZ4HC_init_internal((LZ4HC_CCtx_internal *)state,(BYTE *)inputBuffer);
  }
  return (uint)(bVar1 || state == (void *)0x0);
}

Assistant:

int LZ4_resetStreamStateHC(void* state, char* inputBuffer)
{
    LZ4_streamHC_t* const hc4 = LZ4_initStreamHC(state, sizeof(*hc4));
    if (hc4 == NULL) return 1;   /* init failed */
    LZ4HC_init_internal (&hc4->internal_donotuse, (const BYTE*)inputBuffer);
    return 0;
}